

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall InterCode::InterCode(InterCode *this,int k,Operand *t,Operand *a1,Operand *a2)

{
  this->kind = k;
  Operand::Operand(&this->target,t);
  Operand::Operand(&this->arg1,a1);
  Operand::Operand(&this->arg2,a2);
  return;
}

Assistant:

InterCode(int k, Operand t, Operand a1, Operand a2):
            kind(k), target(move(t)), arg1(move(a1)), arg2(move(a2)) {}